

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O1

uint8_t player_hp_attr(player *p)

{
  uint8_t uVar1;
  
  uVar1 = '\r';
  if (p->chp < p->mhp) {
    uVar1 = '\x04';
    if ((int)((uint)(p->opts).hitpoint_warn * (int)p->mhp) / 10 < (int)p->chp) {
      uVar1 = '\v';
    }
  }
  return uVar1;
}

Assistant:

uint8_t player_hp_attr(struct player *p)
{
	uint8_t attr;
	
	if (p->chp >= p->mhp)
		attr = COLOUR_L_GREEN;
	else if (p->chp > (p->mhp * p->opts.hitpoint_warn) / 10)
		attr = COLOUR_YELLOW;
	else
		attr = COLOUR_RED;
	
	return attr;
}